

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O0

void __thiscall OpenMD::NPT::moveA(NPT *this)

{
  bool bVar1;
  double *pdVar2;
  size_type __n;
  long *in_RDI;
  RealType RVar3;
  iterator *i_00;
  Thermo *in_stack_00000028;
  int k;
  Vector3d COM;
  int index;
  Vector3d sc;
  Vector3d frc;
  Vector3d pos;
  Vector3d vel;
  RealType mass;
  Vector3d ji;
  Vector3d Tb;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  pair<double,_double> *in_stack_fffffffffffffcd8;
  Snapshot *in_stack_fffffffffffffce0;
  StuntDouble *in_stack_fffffffffffffce8;
  StuntDouble *this_00;
  SimInfo *this_01;
  Vector3d *in_stack_fffffffffffffd60;
  StuntDouble *in_stack_fffffffffffffd68;
  Thermo *in_stack_fffffffffffffd88;
  int local_26c;
  undefined1 local_148 [112];
  pair<double,_double> local_d8;
  int local_c4;
  undefined1 local_c0 [48];
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  RealType local_60;
  StuntDouble *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_18);
  Vector3<double>::Vector3((Vector3<double> *)0x215413);
  Vector3<double>::Vector3((Vector3<double> *)0x215420);
  Vector3<double>::Vector3((Vector3<double> *)0x21542d);
  Vector3<double>::Vector3((Vector3<double> *)0x21543a);
  Vector3<double>::Vector3((Vector3<double> *)0x215447);
  Vector3<double>::Vector3((Vector3<double> *)0x215454);
  local_d8 = Snapshot::getThermostat((Snapshot *)in_RDI[0x1c]);
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x34),&local_d8);
  (**(code **)(*in_RDI + 0xc0))();
  this_01 = (SimInfo *)(in_RDI + 0x1b);
  RVar3 = Thermo::getTemperature((Thermo *)this_01);
  in_RDI[0x23] = (long)RVar3;
  Thermo::getPressureTensor(in_stack_00000028);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_stack_fffffffffffffce0,
             (SquareMatrix3<double> *)in_stack_fffffffffffffcd8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x215500);
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x36),0,0)
  ;
  this_00 = (StuntDouble *)*pdVar2;
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x36),1,1)
  ;
  i_00 = (iterator *)((double)this_00 + *pdVar2);
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x36),2,2)
  ;
  in_RDI[0x24] = (long)((((double)i_00 + *pdVar2) * 163882576.0) / 3.0);
  RVar3 = Thermo::getVolume((Thermo *)in_stack_fffffffffffffce0);
  in_RDI[0x25] = (long)RVar3;
  Thermo::getCom(in_stack_fffffffffffffd88);
  (**(code **)(*in_RDI + 0x98))();
  local_20 = SimInfo::beginMolecule(this_01,(MoleculeIterator *)i_00);
  while (local_20 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject((Molecule *)this_01,i_00);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffce8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffce0,
                 (Vector3<double> *)in_stack_fffffffffffffcd8);
      StuntDouble::getFrc(in_stack_fffffffffffffce8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffce0,
                 (Vector3<double> *)in_stack_fffffffffffffcd8);
      local_60 = StuntDouble::getMass(local_28);
      (**(code **)(*in_RDI + 0x80))(in_RDI,local_c0,local_78);
      OpenMD::operator*((double)in_stack_fffffffffffffce8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffce0);
      OpenMD::operator*((double)in_stack_fffffffffffffce8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffce0);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffce8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffce0);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffce0,
                 (Vector<double,_3U> *)in_stack_fffffffffffffcd8);
      StuntDouble::setVel(this_00,(Vector3d *)in_stack_fffffffffffffce8);
      bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffce0);
      if (bVar1) {
        in_stack_fffffffffffffce8 = local_28;
        StuntDouble::getTrq(local_28);
        StuntDouble::lab2Body(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffce0,
                   (Vector3<double> *)in_stack_fffffffffffffcd8);
        StuntDouble::getJ(in_stack_fffffffffffffce8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffce0,
                   (Vector3<double> *)in_stack_fffffffffffffcd8);
        OpenMD::operator*((double)in_stack_fffffffffffffce8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffce0);
        OpenMD::operator*((double)in_stack_fffffffffffffce8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffce0);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffce8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffce0);
        Vector<double,_3U>::operator+=
                  ((Vector<double,_3U> *)in_stack_fffffffffffffce0,
                   (Vector<double,_3U> *)in_stack_fffffffffffffcd8);
        RotationAlgorithm::rotate
                  ((RotationAlgorithm *)this_00,in_stack_fffffffffffffce8,
                   (Vector3d *)in_stack_fffffffffffffce0,(RealType)in_stack_fffffffffffffcd8);
        StuntDouble::setJ(this_00,(Vector3d *)in_stack_fffffffffffffce8);
      }
      local_28 = Molecule::nextIntegrableObject((Molecule *)this_01,i_00);
    }
    local_20 = SimInfo::nextMolecule(this_01,(MoleculeIterator *)i_00);
  }
  in_RDI[0x34] = (long)(((double)in_RDI[2] * ((double)in_RDI[0x23] / (double)in_RDI[0x26] - 1.0)) /
                        (double)in_RDI[0x21] + (double)in_RDI[0x34]);
  (**(code **)(*in_RDI + 0xa8))();
  in_RDI[0x35] = (long)((double)in_RDI[2] * (double)in_RDI[0x34] + (double)in_RDI[0x35]);
  (**(code **)(*(long *)in_RDI[0x12] + 0x20))();
  local_c4 = 0;
  local_20 = SimInfo::beginMolecule(this_01,(MoleculeIterator *)i_00);
  while (local_20 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject((Molecule *)this_01,i_00);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_fffffffffffffce8);
      __n = (size_type)local_c4;
      local_c4 = local_c4 + 1;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 0x2a),__n);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffce0,
                 (Vector3<double> *)in_stack_fffffffffffffcd8);
      local_28 = Molecule::nextIntegrableObject((Molecule *)this_01,i_00);
    }
    local_20 = SimInfo::nextMolecule(this_01,(MoleculeIterator *)i_00);
  }
  for (local_26c = 0; local_26c < (int)in_RDI[0x40]; local_26c = local_26c + 1) {
    local_c4 = 0;
    local_20 = SimInfo::beginMolecule(this_01,(MoleculeIterator *)i_00);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginIntegrableObject((Molecule *)this_01,i_00);
      while (local_28 != (StuntDouble *)0x0) {
        StuntDouble::getVel(in_stack_fffffffffffffce8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffce0,
                   (Vector3<double> *)in_stack_fffffffffffffcd8);
        StuntDouble::getPos(in_stack_fffffffffffffce8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffce0,
                   (Vector3<double> *)in_stack_fffffffffffffcd8);
        (**(code **)(*in_RDI + 0x90))(in_RDI,local_90,local_148,local_c4,local_c0);
        in_stack_fffffffffffffce0 =
             (Snapshot *)
             std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
             operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)(in_RDI + 0x2a),(long)local_c4);
        in_stack_fffffffffffffcd8 = (pair<double,_double> *)in_RDI[1];
        OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffce8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffce0);
        OpenMD::operator*((double)in_stack_fffffffffffffce8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffce0);
        OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffce8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffce0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffce8,
                   (Vector<double,_3U> *)in_stack_fffffffffffffce0);
        StuntDouble::setPos(this_00,(Vector3d *)in_stack_fffffffffffffce8);
        local_c4 = local_c4 + 1;
        local_28 = Molecule::nextIntegrableObject((Molecule *)this_01,i_00);
      }
      local_20 = SimInfo::nextMolecule(this_01,(MoleculeIterator *)i_00);
    }
    Rattle::constraintA((Rattle *)this_00);
  }
  (**(code **)(*in_RDI + 0xb8))();
  Snapshot::setThermostat(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  (**(code **)(*in_RDI + 200))();
  return;
}

Assistant:

void NPT::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    thermostat = snap->getThermostat();
    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step  (use chi from previous step here):

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji +=
              dt2 * Constants::energyConvert * Tb - dt2 * thermostat.first * ji;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve chi and eta  half step

    thermostat.first += dt2 * (instaTemp / targetTemp - 1.0) / tt2;

    evolveEtaA();

    // calculate the integral of chidt
    thermostat.second += dt2 * thermostat.first;

    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    snap->setThermostat(thermostat);

    saveEta();
  }